

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O3

void __thiscall
gimage::Image<float,_gimage::PixelTraits<float>_>::~Image
          (Image<float,_gimage::PixelTraits<float>_> *this)

{
  if ((-1 < this->n) && (this->pixel != (float *)0x0)) {
    operator_delete__(this->pixel);
  }
  if (this->row != (float **)0x0) {
    operator_delete__(this->row);
  }
  if (this->img != (float ***)0x0) {
    operator_delete__(this->img);
    return;
  }
  return;
}

Assistant:

~Image()
    {
      if (n >= 0)
      {
        delete [] pixel;
      }

      delete [] row;
      delete [] img;
    }